

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

BailOutKind IR::EquivalentToMonoTypeCheckBailOutKind(BailOutKind kind)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BailOutKind BVar4;
  
  if ((kind & ~BailOutKindBits) == BailOutFailedEquivalentFixedFieldTypeCheck) {
    BVar4 = kind & BailOutKindBits | BailOutFailedFixedFieldTypeCheck;
  }
  else if ((kind & ~BailOutKindBits) == BailOutFailedEquivalentTypeCheck) {
    BVar4 = kind & BailOutKindBits | BailOutFailedTypeCheck;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                       ,0xa8a,"(0)","0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    BVar4 = BailOutInvalid;
  }
  return BVar4;
}

Assistant:

IR::BailOutKind IR::EquivalentToMonoTypeCheckBailOutKind(IR::BailOutKind kind)
{
    switch (kind & ~IR::BailOutKindBits)
    {
    case IR::BailOutFailedEquivalentTypeCheck:
        return IR::BailOutFailedTypeCheck | (kind & IR::BailOutKindBits);

    case IR::BailOutFailedEquivalentFixedFieldTypeCheck:
        return IR::BailOutFailedFixedFieldTypeCheck | (kind & IR::BailOutKindBits);

    default:
        Assert(0);
        return IR::BailOutInvalid;
    }
}